

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_escape(runtime_type *this,var *b)

{
  proxy *ppVar1;
  bool bVar2;
  type_info *this_00;
  pointer *ppVar3;
  runtime_error *prVar4;
  any *in_RDX;
  allocator local_31;
  string local_30;
  
  this_00 = cs_impl::any::type(in_RDX);
  bVar2 = std::type_info::operator==(this_00,(type_info *)&pointer::typeinfo);
  if (!bVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_30,"Unsupported operator operations(Escape).",&local_31);
    runtime_error::runtime_error(prVar4,&local_30);
    __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  ppVar3 = cs_impl::any::const_val<cs::pointer>(in_RDX);
  ppVar1 = (ppVar3->data).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
    (this->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar1->is_rvalue;
    return (var)(proxy *)this;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Escape from null pointer.",&local_31);
  runtime_error::runtime_error(prVar4,&local_30);
  __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_escape(const var &b)
	{
		if (b.type() == typeid(pointer)) {
			const auto &ptr = b.const_val<pointer>();
			if (ptr.data.usable())
				return ptr.data;
			else
				throw runtime_error("Escape from null pointer.");
		}
		else
			throw runtime_error("Unsupported operator operations(Escape).");
	}